

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shift.c
# Opt level: O0

LispPTR N_OP_lrsh8(LispPTR a)

{
  uint uVar1;
  LispPTR *pLVar2;
  uint *NAddr;
  int *fixpp;
  int arg1;
  LispPTR a_local;
  
  if ((a & 0xfff0000) == 0xe0000) {
    fixpp._4_4_ = a & 0xffff;
  }
  else if ((a & 0xfff0000) == 0xf0000) {
    fixpp._4_4_ = a | 0xffff0000;
  }
  else {
    if ((*(ushort *)((ulong)(MDStypetbl + (a >> 9)) ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = a;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    pLVar2 = NativeAligned4FromLAddr(a);
    fixpp._4_4_ = *pLVar2;
  }
  uVar1 = fixpp._4_4_ >> 8;
  if (fixpp._4_4_ >> 0x18 == 0xffff) {
    arg1 = uVar1 & 0xffff | 0xf0000;
  }
  else if (fixpp._4_4_ >> 0x18 == 0) {
    arg1 = uVar1 | 0xe0000;
  }
  else {
    NAddr = (uint *)createcell68k(2);
    *NAddr = uVar1;
    arg1 = LAddrFromNative(NAddr);
  }
  return arg1;
}

Assistant:

LispPTR N_OP_lrsh8(LispPTR a) {
  int arg1;

  N_GETNUMBER(a, arg1, du_ufn);
  arg1 = (unsigned)arg1 >> 8;
  N_ARITH_SWITCH(arg1);

 du_ufn:
  ERROR_EXIT(a);
}